

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O3

bool __thiscall IR::Opnd::IsEqual(Opnd *this,Opnd *opnd)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  switch(this->m_kind) {
  case OpndKindIntConst:
    bVar2 = IntConstOpnd::IsEqualInternal((IntConstOpnd *)this,opnd);
    return bVar2;
  case OpndKindInt64Const:
    bVar2 = Int64ConstOpnd::IsEqualInternal((Int64ConstOpnd *)this,opnd);
    return bVar2;
  case OpndKindFloatConst:
    bVar2 = FloatConstOpnd::IsEqualInternal((FloatConstOpnd *)this,opnd);
    return bVar2;
  case OpndKindFloat32Const:
    bVar2 = Float32ConstOpnd::IsEqualInternal((Float32ConstOpnd *)this,opnd);
    return bVar2;
  case OpndKindHelperCall:
    bVar2 = HelperCallOpnd::IsDiagHelperCallOpnd((HelperCallOpnd *)this);
    if (bVar2) {
      bVar2 = DiagHelperCallOpnd::IsEqualInternalSub((DiagHelperCallOpnd *)this,opnd);
      return bVar2;
    }
    bVar2 = HelperCallOpnd::IsEqualInternal((HelperCallOpnd *)this,opnd);
    return bVar2;
  case OpndKindSym:
    bVar2 = SymOpnd::IsEqualInternal((SymOpnd *)this,opnd);
    return bVar2;
  case OpndKindReg:
    bVar2 = RegOpnd::IsEqualInternal((RegOpnd *)this,opnd);
    return bVar2;
  case OpndKindAddr:
    bVar2 = AddrOpnd::IsEqualInternal((AddrOpnd *)this,opnd);
    return bVar2;
  case OpndKindIndir:
    bVar2 = IndirOpnd::IsEqualInternal((IndirOpnd *)this,opnd);
    return bVar2;
  case OpndKindLabel:
    bVar2 = LabelOpnd::IsEqualInternal((LabelOpnd *)this,opnd);
    return bVar2;
  case OpndKindMemRef:
    bVar2 = MemRefOpnd::IsEqualInternal((MemRefOpnd *)this,opnd);
    return bVar2;
  case OpndKindRegBV:
    bVar2 = RegBVOpnd::IsEqualInternal((RegBVOpnd *)this,opnd);
    return bVar2;
  case OpndKindList:
    bVar2 = ListOpnd::IsEqualInternal((ListOpnd *)this,opnd);
    return bVar2;
  }
  IsEqual();
  if (this->m_kind != OpndKindIntConst) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                       ,0x5d5,"(m_kind == OpndKindIntConst)","m_kind == OpndKindIntConst");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if ((opnd->m_kind == OpndKindIntConst) && (this->m_type == opnd->m_type)) {
    bVar2 = this[1]._vptr_Opnd == opnd[1]._vptr_Opnd;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool Opnd::IsEqual(Opnd *opnd)
{
    switch (this->m_kind)
    {
    case OpndKindIntConst:
        return static_cast<IntConstOpnd*>(this)->IsEqualInternal(opnd);

    case OpndKindInt64Const:
        return static_cast<Int64ConstOpnd*>(this)->IsEqualInternal(opnd);

    case OpndKindFloatConst:
        return static_cast<FloatConstOpnd*>(this)->IsEqualInternal(opnd);
    case OpndKindFloat32Const:
        return static_cast<Float32ConstOpnd*>(this)->IsEqualInternal(opnd);

    case OpndKindHelperCall:
        if ((*static_cast<HelperCallOpnd*>(this)).IsDiagHelperCallOpnd())
        {
            return static_cast<DiagHelperCallOpnd*>(this)->IsEqualInternalSub(opnd);
        }
        return static_cast<HelperCallOpnd*>(this)->IsEqualInternal(opnd);

    case OpndKindSym:
        //NOTE: use to be Sealed do not do sub class checks like in CloneUse
        return static_cast<SymOpnd*>(this)->IsEqualInternal(opnd);

    case OpndKindReg:
        //NOTE: not sealed but ArrayRegOpnd::isEqual function does not exist, default to RegOpnd only
        return static_cast<RegOpnd*>(this)->IsEqualInternal(opnd);

    case OpndKindAddr:
        return static_cast<AddrOpnd*>(this)->IsEqualInternal(opnd);

    case OpndKindIndir:
        return static_cast<IndirOpnd*>(this)->IsEqualInternal(opnd);

    case OpndKindList:
        return static_cast<ListOpnd*>(this)->IsEqualInternal(opnd);

    case OpndKindMemRef:
        return static_cast<MemRefOpnd*>(this)->IsEqualInternal(opnd);

    case OpndKindLabel:
        return static_cast<LabelOpnd*>(this)->IsEqualInternal(opnd);

    case OpndKindRegBV:
        return static_cast<RegBVOpnd*>(this)->IsEqualInternal(opnd);
    default:
        Assert(UNREACHED);
        __assume(UNREACHED);
    };
}